

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O0

int block_cipher_df(uchar *output,uchar *data,size_t data_len)

{
  ulong uVar1;
  ulong local_380;
  ulong local_378;
  size_t use_len;
  size_t buf_len;
  int local_360;
  int j;
  int i;
  int ret;
  mbedtls_aes_context aes_ctx;
  uchar *iv;
  uchar *p;
  uchar chain [16];
  uchar key [32];
  uchar tmp [48];
  uchar buf [416];
  size_t data_len_local;
  uchar *data_local;
  uchar *output_local;
  
  if (data_len < 0x181) {
    buf._408_8_ = data_len;
    memset(tmp + 0x28,0,0x1a0);
    mbedtls_aes_init((mbedtls_aes_context *)&i);
    buf[8] = SUB81(buf._408_8_,3);
    buf[9] = SUB81(buf._408_8_,2);
    buf[10] = SUB81(buf._408_8_,1);
    buf[0xb] = (uchar)buf._408_8_;
    buf[0xf] = '0';
    memcpy(buf + 0x10,data,buf._408_8_);
    (buf + 0x10)[buf._408_8_] = 0x80;
    uVar1 = buf._408_8_ + 0x19;
    for (local_360 = 0; local_360 < 0x20; local_360 = local_360 + 1) {
      chain[(long)local_360 + 8] = (uchar)local_360;
    }
    j = mbedtls_aes_setkey_enc((mbedtls_aes_context *)&i,chain + 8,0x100);
    if (j == 0) {
      for (buf_len._4_4_ = 0; buf_len._4_4_ < 0x30; buf_len._4_4_ = buf_len._4_4_ + 0x10) {
        iv = tmp + 0x28;
        memset(&p,0,0x10);
        local_378 = uVar1;
        while (local_378 != 0) {
          for (local_360 = 0; local_360 < 0x10; local_360 = local_360 + 1) {
            chain[(long)local_360 + -8] = chain[(long)local_360 + -8] ^ iv[local_360];
          }
          iv = iv + 0x10;
          if (local_378 < 0x10) {
            local_380 = local_378;
          }
          else {
            local_380 = 0x10;
          }
          local_378 = local_378 - local_380;
          j = mbedtls_aes_crypt_ecb((mbedtls_aes_context *)&i,1,(uchar *)&p,(uchar *)&p);
          if (j != 0) goto LAB_0010aeb4;
        }
        *(uchar **)(key + (long)buf_len._4_4_ + 0x18) = p;
        *(undefined8 *)(tmp + buf_len._4_4_) = chain._0_8_;
        tmp[0x2b] = tmp[0x2b] + '\x01';
      }
      j = mbedtls_aes_setkey_enc((mbedtls_aes_context *)&i,key + 0x18,0x100);
      if (j == 0) {
        aes_ctx.buf._264_8_ = tmp + 0x18;
        buf_len._4_4_ = 0;
        iv = output;
        while ((buf_len._4_4_ < 0x30 &&
               (j = mbedtls_aes_crypt_ecb
                              ((mbedtls_aes_context *)&i,1,(uchar *)aes_ctx.buf._264_8_,
                               (uchar *)aes_ctx.buf._264_8_), j == 0))) {
          *(undefined8 *)iv = *(undefined8 *)aes_ctx.buf._264_8_;
          *(undefined8 *)(iv + 8) = *(undefined8 *)(aes_ctx.buf._264_8_ + 8);
          iv = iv + 0x10;
          buf_len._4_4_ = buf_len._4_4_ + 0x10;
        }
      }
    }
LAB_0010aeb4:
    mbedtls_aes_free((mbedtls_aes_context *)&i);
    mbedtls_platform_zeroize(tmp + 0x28,0x1a0);
    mbedtls_platform_zeroize(key + 0x18,0x30);
    mbedtls_platform_zeroize(chain + 8,0x20);
    mbedtls_platform_zeroize(&p,0x10);
    if (j != 0) {
      mbedtls_platform_zeroize(output,0x30);
    }
    output_local._4_4_ = j;
  }
  else {
    output_local._4_4_ = -0x38;
  }
  return output_local._4_4_;
}

Assistant:

static int block_cipher_df( unsigned char *output,
                            const unsigned char *data, size_t data_len )
{
    unsigned char buf[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT +
                      MBEDTLS_CTR_DRBG_BLOCKSIZE + 16];
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char key[MBEDTLS_CTR_DRBG_KEYSIZE];
    unsigned char chain[MBEDTLS_CTR_DRBG_BLOCKSIZE];
    unsigned char *p, *iv;
    mbedtls_aes_context aes_ctx;
    int ret = 0;

    int i, j;
    size_t buf_len, use_len;

    if( data_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( buf, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT +
            MBEDTLS_CTR_DRBG_BLOCKSIZE + 16 );
    mbedtls_aes_init( &aes_ctx );

    /*
     * Construct IV (16 bytes) and S in buffer
     * IV = Counter (in 32-bits) padded to 16 with zeroes
     * S = Length input string (in 32-bits) || Length of output (in 32-bits) ||
     *     data || 0x80
     *     (Total is padded to a multiple of 16-bytes with zeroes)
     */
    p = buf + MBEDTLS_CTR_DRBG_BLOCKSIZE;
    *p++ = ( data_len >> 24 ) & 0xff;
    *p++ = ( data_len >> 16 ) & 0xff;
    *p++ = ( data_len >> 8  ) & 0xff;
    *p++ = ( data_len       ) & 0xff;
    p += 3;
    *p++ = MBEDTLS_CTR_DRBG_SEEDLEN;
    memcpy( p, data, data_len );
    p[data_len] = 0x80;

    buf_len = MBEDTLS_CTR_DRBG_BLOCKSIZE + 8 + data_len + 1;

    for( i = 0; i < MBEDTLS_CTR_DRBG_KEYSIZE; i++ )
        key[i] = i;

    if( ( ret = mbedtls_aes_setkey_enc( &aes_ctx, key,
                                        MBEDTLS_CTR_DRBG_KEYBITS ) ) != 0 )
    {
        goto exit;
    }

    /*
     * Reduce data to MBEDTLS_CTR_DRBG_SEEDLEN bytes of data
     */
    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        p = buf;
        memset( chain, 0, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        use_len = buf_len;

        while( use_len > 0 )
        {
            for( i = 0; i < MBEDTLS_CTR_DRBG_BLOCKSIZE; i++ )
                chain[i] ^= p[i];
            p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
            use_len -= ( use_len >= MBEDTLS_CTR_DRBG_BLOCKSIZE ) ?
                       MBEDTLS_CTR_DRBG_BLOCKSIZE : use_len;

            if( ( ret = mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT,
                                               chain, chain ) ) != 0 )
            {
                goto exit;
            }
        }

        memcpy( tmp + j, chain, MBEDTLS_CTR_DRBG_BLOCKSIZE );

        /*
         * Update IV
         */
        buf[3]++;
    }

    /*
     * Do final encryption with reduced data
     */
    if( ( ret = mbedtls_aes_setkey_enc( &aes_ctx, tmp,
                                        MBEDTLS_CTR_DRBG_KEYBITS ) ) != 0 )
    {
        goto exit;
    }
    iv = tmp + MBEDTLS_CTR_DRBG_KEYSIZE;
    p = output;

    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        if( ( ret = mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT,
                                           iv, iv ) ) != 0 )
        {
            goto exit;
        }
        memcpy( p, iv, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }
exit:
    mbedtls_aes_free( &aes_ctx );
    /*
    * tidy up the stack
    */
    mbedtls_platform_zeroize( buf, sizeof( buf ) );
    mbedtls_platform_zeroize( tmp, sizeof( tmp ) );
    mbedtls_platform_zeroize( key, sizeof( key ) );
    mbedtls_platform_zeroize( chain, sizeof( chain ) );
    if( 0 != ret )
    {
        /*
        * wipe partial seed from memory
        */
        mbedtls_platform_zeroize( output, MBEDTLS_CTR_DRBG_SEEDLEN );
    }

    return( ret );
}